

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

void Bmc_CexPerformUnrollingTest(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  abctime aVar1;
  Gia_Man_t *p_00;
  abctime aVar2;
  abctime time;
  char *pStr;
  
  aVar1 = Abc_Clock();
  p_00 = Bmc_CexPerformUnrolling(p,pCex);
  Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  pStr = "unroll.aig";
  Gia_AigerWrite(p_00,"unroll.aig",0,0,0);
  Gia_ManStop(p_00);
  puts("CE-induced network is written into file \"unroll.aig\".");
  aVar2 = Abc_Clock();
  Abc_PrintTime((int)aVar2 - (int)aVar1,pStr,time);
  return;
}

Assistant:

void Bmc_CexPerformUnrollingTest( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew;
    abctime clk = Abc_Clock();
    pNew = Bmc_CexPerformUnrolling( p, pCex );
    Gia_ManPrintStats( pNew, NULL );
    Gia_AigerWrite( pNew, "unroll.aig", 0, 0, 0 );
//Bmc_CexDumpAogStats( pNew, Abc_Clock() - clk );
    Gia_ManStop( pNew );
    printf( "CE-induced network is written into file \"unroll.aig\".\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}